

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O0

ostream * operator<<(ostream *out,DataSet *dataset)

{
  DataSet *this;
  ostream *poVar1;
  double dVar2;
  Shape SVar3;
  uint uStack_64;
  uint local_5c;
  uint j;
  uint local_48;
  uint local_3c;
  uint i;
  Shape local_24;
  DataSet *local_18;
  DataSet *dataset_local;
  ostream *out_local;
  
  local_18 = dataset;
  dataset_local = (DataSet *)out;
  SVar3 = DataSet::shape(dataset);
  local_24._0_8_ = SVar3._0_8_;
  local_24.is_diogonal = SVar3.is_diogonal;
  poVar1 = operator<<(out,&local_24);
  std::operator<<(poVar1,'\n');
  local_3c = 0;
  while( true ) {
    SVar3 = Matrix<double>::shape(&local_18->m_matrix);
    local_48 = SVar3.n_row;
    if (local_48 <= local_3c) break;
    local_5c = 0;
    while( true ) {
      SVar3 = Matrix<double>::shape(&local_18->m_matrix);
      this = dataset_local;
      uStack_64 = SVar3.n_col;
      if (uStack_64 <= local_5c) break;
      dVar2 = Matrix<double>::get(&local_18->m_matrix,local_3c,local_5c);
      poVar1 = (ostream *)std::ostream::operator<<(this,dVar2);
      std::operator<<(poVar1,'\t');
      local_5c = local_5c + 1;
    }
    std::operator<<((ostream *)dataset_local,'\n');
    local_3c = local_3c + 1;
  }
  return (ostream *)dataset_local;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const DataSet& dataset){
    out<<dataset.shape()<<'\n';
    for(unsigned i=0;i<dataset.m_matrix.shape().n_row;++i){
        for(unsigned j=0;j<dataset.m_matrix.shape().n_col;++j){
            out<<dataset.m_matrix.get(i,j)<<'\t';
        }   out<<'\n';
    }
    return out;
}